

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

double __thiscall pugi::xpath_query::evaluate_number(xpath_query *this,xpath_node *n)

{
  undefined8 uVar1;
  xpath_node *in_RSI;
  long *in_RDI;
  double r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_stack_data *this_00;
  xpath_stack *in_stack_ffffffffffffe1e8;
  xpath_context *in_stack_ffffffffffffe1f0;
  xpath_ast_node *in_stack_ffffffffffffe1f8;
  byte local_40;
  undefined8 local_8;
  
  if (*in_RDI == 0) {
    local_8 = impl::anon_unknown_0::gen_nan();
  }
  else {
    this_00 = (xpath_stack_data *)&stack0xffffffffffffffc8;
    impl::anon_unknown_0::xpath_context::xpath_context((xpath_context *)this_00,in_RSI,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data(this_00);
    local_8 = impl::anon_unknown_0::xpath_ast_node::eval_number
                        (in_stack_ffffffffffffe1f8,in_stack_ffffffffffffe1f0,
                         in_stack_ffffffffffffe1e8);
    if ((local_40 & 1) != 0) {
      uVar1 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc((bad_alloc *)this_00);
      __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(this_00);
  }
  return (double)local_8;
}

Assistant:

PUGI__FN double xpath_query::evaluate_number(const xpath_node& n) const
	{
		if (!_impl) return impl::gen_nan();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		double r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_number(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return impl::gen_nan();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}